

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *descriptor,string *error)

{
  bool bVar1;
  int iVar2;
  int *args_1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  int local_5c;
  unique_lock<std::recursive_mutex> local_58;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (int *)0xae9;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_58,&this->cs_desc_man,
             "cs_desc_man",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xae9,false);
  bVar1 = HasWalletDescriptor(this,descriptor);
  if (bVar1) {
    if ((this->m_wallet_descriptor).range_start < descriptor->range_start) {
      iVar2 = (this->m_wallet_descriptor).range_end;
    }
    else {
      iVar2 = (this->m_wallet_descriptor).range_end;
      bVar1 = true;
      if (iVar2 <= descriptor->range_end) goto LAB_0096c1b9;
    }
    local_5c = iVar2 + -1;
    tinyformat::format<int,int>
              (&local_48,(tinyformat *)"new range must include current range = [%d,%d]",
               (char *)&(this->m_wallet_descriptor).range_start,&local_5c,args_1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (error,"can only update matching descriptor");
  }
  bVar1 = false;
LAB_0096c1b9:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::CanUpdateToWalletDescriptor(const WalletDescriptor& descriptor, std::string& error)
{
    LOCK(cs_desc_man);
    if (!HasWalletDescriptor(descriptor)) {
        error = "can only update matching descriptor";
        return false;
    }

    if (descriptor.range_start > m_wallet_descriptor.range_start ||
        descriptor.range_end < m_wallet_descriptor.range_end) {
        // Use inclusive range for error
        error = strprintf("new range must include current range = [%d,%d]",
                          m_wallet_descriptor.range_start,
                          m_wallet_descriptor.range_end - 1);
        return false;
    }

    return true;
}